

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_read_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __off64_t _Var6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  undefined1 *unaff_RBX;
  uv_fs_t *puVar10;
  undefined1 *puVar11;
  long unaff_R12;
  char *pcVar12;
  uv_fs_t *unaff_R14;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  uv_buf_t uVar16;
  undefined1 auVar17 [16];
  char scratch [768];
  undefined1 auStack_462 [2];
  code *pcStack_460;
  undefined8 uStack_458;
  long lStack_448;
  void *pvStack_440;
  long lStack_438;
  undefined1 auStack_3c8 [16];
  undefined1 auStack_3b8 [16];
  undefined8 uStack_3a0;
  uv_fs_t *puStack_398;
  uv_fs_t *puStack_390;
  undefined8 uStack_388;
  code *pcStack_378;
  code *pcStack_370;
  undefined8 local_368;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [256];
  undefined1 local_218 [256];
  undefined1 local_118 [128];
  undefined1 local_98 [136];
  
  iVar3 = 0;
  pcStack_370 = (code *)0x157ced;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_370 = (code *)0x157f25;
    fs_read_bufs_cold_1();
LAB_00157f25:
    pcStack_370 = (code *)0x157f2a;
    fs_read_bufs_cold_2();
LAB_00157f2a:
    pcStack_370 = (code *)0x157f2f;
    fs_read_bufs_cold_3();
LAB_00157f2f:
    pcStack_370 = (code *)0x157f34;
    fs_read_bufs_cold_4();
LAB_00157f34:
    pcStack_370 = (code *)0x157f39;
    fs_read_bufs_cold_5();
LAB_00157f39:
    pcStack_370 = (code *)0x157f3e;
    fs_read_bufs_cold_6();
LAB_00157f3e:
    pcStack_370 = (code *)0x157f43;
    fs_read_bufs_cold_7();
LAB_00157f43:
    pcStack_370 = (code *)0x157f48;
    fs_read_bufs_cold_8();
LAB_00157f48:
    pcStack_370 = (code *)0x157f4d;
    fs_read_bufs_cold_9();
LAB_00157f4d:
    pcStack_370 = (code *)0x157f52;
    fs_read_bufs_cold_10();
LAB_00157f52:
    pcStack_370 = (code *)0x157f57;
    fs_read_bufs_cold_11();
LAB_00157f57:
    pcStack_370 = (code *)0x157f5c;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157f25;
    pcStack_370 = (code *)0x157d0f;
    uv_fs_req_cleanup();
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157d33;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157f2a;
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157d63;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157f2f;
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157d93;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,local_358,0,0);
    if (iVar2 != -0x16) goto LAB_00157f34;
    pcStack_370 = (code *)0x157dab;
    local_358 = uv_buf_init(local_318,0x100);
    unaff_RBX = local_358;
    pcStack_370 = (code *)0x157dc9;
    local_348 = uv_buf_init(local_218,0x100);
    pcStack_370 = (code *)0x157de3;
    local_338 = uv_buf_init(local_118,0x80);
    pcStack_370 = (code *)0x157dfd;
    local_328 = uv_buf_init(local_98,0x80);
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157e2d;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,unaff_RBX,2,0);
    if (iVar2 != 0x1be) goto LAB_00157f39;
    if (read_req.result != 0x1be) goto LAB_00157f3e;
    unaff_RBX = local_338;
    unaff_R14 = &read_req;
    pcStack_370 = (code *)0x157e5d;
    uv_fs_req_cleanup();
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157e84;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,unaff_RBX,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157f43;
    if (read_req.result != 0xbe) goto LAB_00157f48;
    pcStack_370 = (code *)0x157eac;
    uv_fs_req_cleanup(&read_req);
    unaff_RBX = (undefined1 *)local_348._0_8_;
    pcStack_370 = (code *)0x157ec3;
    puVar11 = (undefined1 *)local_348._0_8_;
    iVar2 = bcmp((void *)local_348._0_8_,(void *)local_338._0_8_,0x80);
    iVar3 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00157f4d;
    unaff_RBX = unaff_RBX + 0x80;
    pcStack_370 = (code *)0x157ee1;
    puVar11 = unaff_RBX;
    iVar2 = bcmp(unaff_RBX,(void *)local_328._0_8_,0x3e);
    iVar3 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00157f52;
    iVar3 = 0;
    pcStack_370 = (code *)0x157efb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157f57;
    if (close_req.result == 0) {
      pcStack_370 = (code *)0x157f15;
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  pcStack_370 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_378 = (code *)0x157f67;
  pcStack_370 = (code *)unaff_RBX;
  fs_read_file_eof(iVar3);
  pcStack_378 = (code *)0x157f6c;
  fs_read_file_eof(iVar3);
  pcStack_378 = (code *)0x157f71;
  uVar4 = uv_default_loop();
  pcStack_378 = (code *)0x157f85;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_378 = (code *)0x157f8f;
  uv_run(uVar4,0);
  pcStack_378 = (code *)0x157f94;
  uVar5 = uv_default_loop();
  pcStack_378 = (code *)0x157f9c;
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  pcStack_378 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar10 = (uv_fs_t *)0x184385;
  puStack_390 = (uv_fs_t *)0x157fbd;
  pcStack_378 = (code *)uVar4;
  unlink("test_file");
  puStack_390 = (uv_fs_t *)0x157fc2;
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0;
  puStack_390 = (uv_fs_t *)0x157fe8;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_390 = (uv_fs_t *)0x158245;
    fs_read_file_eof_cold_1();
LAB_00158245:
    puStack_390 = (uv_fs_t *)0x15824a;
    fs_read_file_eof_cold_2();
LAB_0015824a:
    puStack_390 = (uv_fs_t *)0x15824f;
    fs_read_file_eof_cold_3();
LAB_0015824f:
    puStack_390 = (uv_fs_t *)0x158254;
    fs_read_file_eof_cold_4();
LAB_00158254:
    puStack_390 = (uv_fs_t *)0x158259;
    fs_read_file_eof_cold_5();
LAB_00158259:
    puStack_390 = (uv_fs_t *)0x15825e;
    fs_read_file_eof_cold_6();
LAB_0015825e:
    puStack_390 = (uv_fs_t *)0x158263;
    fs_read_file_eof_cold_7();
LAB_00158263:
    puStack_390 = (uv_fs_t *)0x158268;
    fs_read_file_eof_cold_8();
LAB_00158268:
    puStack_390 = (uv_fs_t *)0x15826d;
    fs_read_file_eof_cold_9();
LAB_0015826d:
    puStack_390 = (uv_fs_t *)0x158272;
    fs_read_file_eof_cold_10();
LAB_00158272:
    puStack_390 = (uv_fs_t *)0x158277;
    fs_read_file_eof_cold_11();
LAB_00158277:
    puStack_390 = (uv_fs_t *)0x15827c;
    fs_read_file_eof_cold_12();
LAB_0015827c:
    puStack_390 = (uv_fs_t *)0x158281;
    fs_read_file_eof_cold_13();
LAB_00158281:
    puStack_390 = (uv_fs_t *)0x158286;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158245;
    puStack_390 = (uv_fs_t *)0x15800a;
    uv_fs_req_cleanup(&open_req1);
    puStack_390 = (uv_fs_t *)0x15801b;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x158059;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015824a;
    if (write_req.result < 0) goto LAB_0015824f;
    puStack_390 = (uv_fs_t *)0x15807b;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x158091;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158254;
    if (close_req.result != 0) goto LAB_00158259;
    puStack_390 = (uv_fs_t *)0x1580b3;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x1580d0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_0015825e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158263;
    puStack_390 = (uv_fs_t *)0x1580f2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_390 = (uv_fs_t *)0x158114;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x158152;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158268;
    if (read_req.result < 0) goto LAB_0015826d;
    iVar3 = 0x2e3070;
    puStack_390 = (uv_fs_t *)0x15817b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158272;
    puVar10 = &read_req;
    puStack_390 = (uv_fs_t *)0x158192;
    uv_fs_req_cleanup(&read_req);
    puStack_390 = (uv_fs_t *)0x1581a3;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x1581dd;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_00158277;
    if (read_req.result != 0) goto LAB_0015827c;
    puStack_390 = (uv_fs_t *)0x1581ff;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x158215;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158281;
    if (close_req.result == 0) {
      puStack_390 = (uv_fs_t *)0x15822f;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_390 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_398 = (uv_fs_t *)0x158291;
  puStack_390 = puVar10;
  fs_write_multiple_bufs(iVar3);
  puStack_398 = (uv_fs_t *)0x158296;
  fs_write_multiple_bufs(iVar3);
  puStack_398 = (uv_fs_t *)0x15829b;
  uVar4 = uv_default_loop();
  puStack_398 = (uv_fs_t *)0x1582af;
  uv_walk(uVar4,close_walk_cb,0);
  puStack_398 = (uv_fs_t *)0x1582b9;
  uv_run(uVar4,0);
  puStack_398 = (uv_fs_t *)0x1582be;
  uVar5 = uv_default_loop();
  puStack_398 = (uv_fs_t *)0x1582c6;
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  puStack_398 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_3a0 = uVar4;
  puStack_398 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00158766:
    fs_write_multiple_bufs_cold_2();
LAB_0015876b:
    fs_write_multiple_bufs_cold_3();
LAB_00158770:
    fs_write_multiple_bufs_cold_4();
LAB_00158775:
    fs_write_multiple_bufs_cold_5();
LAB_0015877a:
    fs_write_multiple_bufs_cold_6();
LAB_0015877f:
    fs_write_multiple_bufs_cold_7();
LAB_00158784:
    fs_write_multiple_bufs_cold_8();
LAB_00158789:
    fs_write_multiple_bufs_cold_9();
LAB_0015878e:
    fs_write_multiple_bufs_cold_10();
LAB_00158793:
    fs_write_multiple_bufs_cold_11();
LAB_00158798:
    fs_write_multiple_bufs_cold_12();
LAB_0015879d:
    fs_write_multiple_bufs_cold_13();
LAB_001587a2:
    fs_write_multiple_bufs_cold_14();
LAB_001587a7:
    fs_write_multiple_bufs_cold_15();
LAB_001587ac:
    fs_write_multiple_bufs_cold_16();
LAB_001587b1:
    fs_write_multiple_bufs_cold_19();
LAB_001587b6:
    fs_write_multiple_bufs_cold_20();
LAB_001587bb:
    fs_write_multiple_bufs_cold_21();
LAB_001587c0:
    fs_write_multiple_bufs_cold_22();
LAB_001587c5:
    fs_write_multiple_bufs_cold_23();
LAB_001587ca:
    fs_write_multiple_bufs_cold_24();
LAB_001587cf:
    fs_write_multiple_bufs_cold_25();
LAB_001587d4:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158766;
    uv_fs_req_cleanup(&open_req1);
    auStack_3c8 = uv_buf_init(test_buf,0xd);
    auStack_3b8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_3c8,2,0);
    if (iVar3 < 0) goto LAB_0015876b;
    if (write_req.result < 0) goto LAB_00158770;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158775;
    if (close_req.result != 0) goto LAB_0015877a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_0015877f;
    if (open_req1.result._4_4_ < 0) goto LAB_00158784;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar17 = uv_buf_init(buf,0xd);
    auStack_3c8 = auVar17;
    auVar17 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_3b8 = auVar17;
    _Var6 = lseek64((int)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_00158789;
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3c8,2,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_0015878e;
    if (read_req.result != 0x1c) goto LAB_00158793;
    iVar2 = 0x2e3070;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00158798;
    iVar2 = 0x2e4460;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_0015879d;
    uv_fs_req_cleanup(&read_req);
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar16;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_001587a2;
    if (read_req.result != 0) goto LAB_001587a7;
    uv_fs_req_cleanup(&read_req);
    auVar17 = uv_buf_init(buf,0xd);
    auStack_3c8 = auVar17;
    auVar17 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_3b8 = auVar17;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3c8,2,0);
    if (iVar3 < 0) goto LAB_001587ac;
    if (read_req.result == 0x1c) {
LAB_00158664:
      iVar2 = 0x2e3070;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_001587b1;
      iVar2 = 0x2e4460;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_001587b6;
      uv_fs_req_cleanup(&read_req);
      uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar16;
      iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar3 != 0) goto LAB_001587bb;
      if (read_req.result != 0) goto LAB_001587c0;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar3 != 0) goto LAB_001587c5;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001587ca;
    }
    if (read_req.result != 0xd) goto LAB_001587cf;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3b8,1,read_req.result);
    if (iVar3 < 0) goto LAB_001587d4;
    if (read_req.result == 0xf) goto LAB_00158664;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar7 = malloc(0xd4310);
  if (pvVar7 == (void *)0x0) {
LAB_00158b56:
    fs_write_alotof_bufs_cold_18();
LAB_00158b5b:
    fs_write_alotof_bufs_cold_1();
LAB_00158b60:
    fs_write_alotof_bufs_cold_2();
LAB_00158b65:
    fs_write_alotof_bufs_cold_3();
LAB_00158b6a:
    fs_write_alotof_bufs_cold_4();
LAB_00158b6f:
    fs_write_alotof_bufs_cold_17();
LAB_00158b74:
    fs_write_alotof_bufs_cold_5();
LAB_00158b79:
    fs_write_alotof_bufs_cold_6();
LAB_00158b7e:
    fs_write_alotof_bufs_cold_7();
LAB_00158b83:
    fs_write_alotof_bufs_cold_8();
LAB_00158b88:
    fs_write_alotof_bufs_cold_9();
LAB_00158b8d:
    fs_write_alotof_bufs_cold_10();
LAB_00158b92:
    fs_write_alotof_bufs_cold_12();
LAB_00158b97:
    fs_write_alotof_bufs_cold_13();
LAB_00158b9c:
    fs_write_alotof_bufs_cold_14();
LAB_00158ba1:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158b5b;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b60;
    uv_fs_req_cleanup(&open_req1);
    lVar14 = 8;
    do {
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar7 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar7 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158b65;
    if (write_req.result != 0xac67d) goto LAB_00158b6a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar8 = malloc(0xac67d);
    if (pvVar8 == (void *)0x0) goto LAB_00158b6f;
    lVar14 = 8;
    pvVar15 = pvVar8;
    do {
      auVar17 = uv_buf_init(pvVar15,0xd);
      *(long *)((long)pvVar7 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar7 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
      pvVar15 = (void *)((long)pvVar15 + 0xd);
    } while (lVar14 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar3 != 0) goto LAB_00158b74;
    if (close_req.result != 0) goto LAB_00158b79;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00158b7e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b83;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158b88;
    if (read_req.result != 0x3400) goto LAB_00158b8d;
    unaff_R12 = 0;
    do {
      pcVar9 = (char *)((long)pvVar8 + unaff_R12);
      iVar3 = strncmp(pcVar9,test_buf,0xd);
      iVar2 = (int)pcVar9;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158b56;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar8);
    iVar2 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00158b92;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar16;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00158b97;
    if (read_req.result != 0) goto LAB_00158b9c;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158ba1;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar7);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar7 = (void *)uv_default_loop();
  uv_walk(pvVar7,close_walk_cb,0);
  uv_run(pvVar7,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_460 = (code *)0x158c0d;
  pvStack_440 = pvVar7;
  lStack_438 = unaff_R12;
  unlink("test_file");
  pcStack_460 = (code *)0x158c12;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_460 = (code *)0x158c23;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00158f6f:
    pvVar8 = pvVar7;
    pcStack_460 = (code *)0x158f74;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158f74:
    pcStack_460 = (code *)0x158f79;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158f79:
    pcStack_460 = (code *)0x158f7e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158f7e:
    pcStack_460 = (code *)0x158f83;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158f83:
    pcStack_460 = (code *)0x158f88;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158f88:
    pcStack_460 = (code *)0x158f8d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158f8d:
    pcStack_460 = (code *)0x158f92;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158f92:
    pcStack_460 = (code *)0x158f97;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158f97:
    pcStack_460 = (code *)0x158f9c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158f9c:
    pcStack_460 = (code *)0x158fa1;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158fa1:
    pcStack_460 = (code *)0x158fa6;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158fa6:
    pcStack_460 = (code *)0x158fab;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158fab:
    pcStack_460 = (code *)0x158fb0;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158fb0:
    pcStack_460 = (code *)0x158fb5;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158fb5:
    pcStack_460 = (code *)0x158fba;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_460 = (code *)0x158c52;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158f74;
    if (open_req1.result._4_4_ < 0) goto LAB_00158f79;
    pcStack_460 = (code *)0x158c74;
    uv_fs_req_cleanup(&open_req1);
    pcStack_460 = (code *)0x158c85;
    uVar16 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_458 = 0;
    pcStack_460 = (code *)0x158cc3;
    iov = uVar16;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158f7e;
    if (write_req.result != 10) goto LAB_00158f83;
    pcStack_460 = (code *)0x158ce8;
    uv_fs_req_cleanup(&write_req);
    lVar14 = 8;
    do {
      pcStack_460 = (code *)0x158d02;
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0xd4318);
    uStack_458 = 0;
    pcStack_460 = (code *)0x158d43;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f88;
    if (write_req.result != 0xac67d) goto LAB_00158f8d;
    pcStack_460 = (code *)0x158d68;
    uv_fs_req_cleanup(&write_req);
    pcStack_460 = (code *)0x158d72;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_00158f92;
    lVar14 = 8;
    pcVar12 = pcVar9;
    do {
      pcStack_460 = (code *)0x158d94;
      auVar17 = uv_buf_init(pcVar12,0xd);
      *(long *)((long)pvVar8 + lVar14 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar14) = auVar17._8_8_;
      lVar14 = lVar14 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar14 != 0xd4318);
    uStack_458 = 0;
    pcStack_460 = (code *)0x158dd6;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f97;
    lStack_448 = 10;
    lVar14 = 0xd;
    if (iVar2 != 0xd) {
      lVar14 = 0x3400;
    }
    if (read_req.result != lVar14) goto LAB_00158f9c;
    pcVar12 = pcVar9;
    uVar13 = 0;
    do {
      pcStack_460 = (code *)0x158e20;
      iVar3 = strncmp(pcVar12,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_460 = (code *)0x158f6f;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar7 = pvVar8;
        goto LAB_00158f6f;
      }
      if (iVar2 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar13 < 0x3ff;
      uVar13 = uVar13 + 1;
    } while (bVar1);
    pcStack_460 = (code *)0x158e4d;
    uv_fs_req_cleanup(&read_req);
    pcStack_460 = (code *)0x158e55;
    free(pcVar9);
    pcStack_460 = (code *)0x158e6c;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar14 = lStack_448;
    if (iVar2 != 0) goto LAB_00158fa1;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_448) goto LAB_00158fa6;
    pcStack_460 = (code *)0x158ea0;
    uv_fs_req_cleanup(&stat_req);
    pcStack_460 = (code *)0x158eb1;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_458 = 0;
    pcStack_460 = (code *)0x158ef2;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar14 + write_req.result);
    if (iVar2 != 0) goto LAB_00158fab;
    if (read_req.result != 0) goto LAB_00158fb0;
    pcStack_460 = (code *)0x158f14;
    uv_fs_req_cleanup(&read_req);
    pcStack_460 = (code *)0x158f2a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158fb5;
    if (close_req.result == 0) {
      pcStack_460 = (code *)0x158f48;
      uv_fs_req_cleanup(&close_req);
      pcStack_460 = (code *)0x158f54;
      unlink("test_file");
      free(pvVar8);
      return;
    }
  }
  pcStack_460 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_460 = (code *)pvVar8;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00159131;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159136;
    uv_fs_req_cleanup(&open_req1);
    uVar16 = (uv_buf_t)uv_buf_init(auStack_462,2);
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_0015913b;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00159145;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00159131:
    run_test_fs_read_dir_cold_2();
LAB_00159136:
    run_test_fs_read_dir_cold_3();
LAB_0015913b:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159145:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_read_bufs(int add_flags) {
  char scratch[768];
  uv_buf_t bufs[4];

  ASSERT(0 <= uv_fs_open(NULL, &open_req1,
                         "test/fixtures/lorem_ipsum.txt",
                         O_RDONLY | add_flags, 0, NULL));
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 0, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 1, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 bufs, 0, 0, NULL));

  bufs[0] = uv_buf_init(scratch + 0, 256);
  bufs[1] = uv_buf_init(scratch + 256, 256);
  bufs[2] = uv_buf_init(scratch + 512, 128);
  bufs[3] = uv_buf_init(scratch + 640, 128);

  ASSERT(446 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 0,
                           2,  /* 2x 256 bytes. */
                           0,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == 446);
  uv_fs_req_cleanup(&read_req);

  ASSERT(190 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 2,
                           2,  /* 2x 128 bytes. */
                           256,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == /* 446 - 256 */ 190);
  uv_fs_req_cleanup(&read_req);

  ASSERT(0 == memcmp(bufs[1].base + 0, bufs[2].base, 128));
  ASSERT(0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128));

  ASSERT(0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL));
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);
}